

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::checkHOutlines(QPDF *this)

{
  int iVar1;
  bool bVar2;
  pointer pMVar3;
  size_type sVar4;
  qpdf_offset_t __val;
  qpdf_offset_t qVar5;
  string_view local_2a8;
  string_view local_298;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string_view local_1e8;
  int local_1d4;
  undefined1 local_1d0 [4];
  int table_length;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string_view local_130;
  qpdf_offset_t local_120;
  qpdf_offset_t table_offset;
  int local_110;
  allocator<char> local_109;
  int length;
  undefined1 local_e8 [8];
  ObjUser ou;
  qpdf_offset_t offset;
  string local_a8;
  QPDFObjGen local_84;
  QPDFObjGen og;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [24];
  QPDFObjectHandle outlines;
  QPDF *this_local;
  
  outlines.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  iVar1 = (pMVar3->c_outline_data).nobjects;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if (iVar1 == (pMVar3->outline_hints).nobjects) {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    if ((pMVar3->c_outline_data).nobjects != 0) {
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      iVar1 = (pMVar3->c_outline_data).first_object;
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      if (iVar1 == (pMVar3->outline_hints).first_object) {
        getRoot((QPDF *)local_30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_50,"/Outlines",&local_51);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_30 + 0x10),(string *)local_30);
        std::__cxx11::string::~string(local_50);
        std::allocator<char>::~allocator(&local_51);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
        bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)(local_30 + 0x10));
        if (bVar2) {
          local_84 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)(local_30 + 0x10));
          pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          sVar4 = std::
                  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                  ::count(&pMVar3->xref_table,&local_84);
          if (sVar4 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a8,"unknown object in outlines hint table",
                       (allocator<char> *)((long)&offset + 7));
            stopOnError(this,&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&offset + 7));
          }
          ou.key.field_2._8_4_ = local_84.obj;
          ou.key.field_2._12_4_ = local_84.gen;
          __val = getLinearizationOffset(this,local_84);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&length,"/Outlines",&local_109);
          ObjUser::ObjUser((ObjUser *)local_e8,ou_root_key,(string *)&length);
          std::__cxx11::string::~string((string *)&length);
          std::allocator<char>::~allocator(&local_109);
          qVar5 = maxEnd(this,(ObjUser *)local_e8);
          table_offset = qVar5 - __val;
          local_110 = toI<long_long>(&table_offset);
          pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          local_120 = adjusted_offset(this,(pMVar3->outline_hints).first_object_offset);
          if (__val != local_120) {
            std::__cxx11::to_string(&local_1b0,local_120);
            std::operator+(&local_190,"incorrect offset in outlines table: hint table = ",&local_1b0
                          );
            std::operator+(&local_170,&local_190,"; computed = ");
            std::__cxx11::to_string((string *)local_1d0,__val);
            std::operator+(&local_150,&local_170,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d0);
            local_130 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_150);
            linearizationWarning(this,local_130);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)local_1d0);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_1b0);
          }
          pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          local_1d4 = (pMVar3->outline_hints).group_length;
          if (local_110 != local_1d4) {
            std::__cxx11::to_string(&local_268,local_1d4);
            std::operator+(&local_248,"incorrect length in outlines table: hint table = ",&local_268
                          );
            std::operator+(&local_228,&local_248,"; computed = ");
            std::__cxx11::to_string(&local_288,local_110);
            std::operator+(&local_208,&local_228,&local_288);
            local_1e8 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_208);
            linearizationWarning(this,local_1e8);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_268);
          }
          ObjUser::~ObjUser((ObjUser *)local_e8);
          og.obj = 0;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&og.gen,
                     "/Outlines key of root dictionary is not indirect");
          linearizationWarning(this,stack0xffffffffffffff88);
          og.obj = 1;
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_30 + 0x10));
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_298,"incorrect first object number in outline hints table.");
        linearizationWarning(this,local_298);
      }
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a8,"incorrect object count in outline hint table");
    linearizationWarning(this,local_2a8);
  }
  return;
}

Assistant:

void
QPDF::checkHOutlines()
{
    // Empirically, Acrobat generates the correct value for the object number but incorrectly stores
    // the next object number's offset as the offset, at least when outlines appear in part 6.  It
    // also generates an incorrect value for length (specifically, the length that would cover the
    // correct number of objects from the wrong starting place).  pdlin appears to generate correct
    // values in those cases.

    if (m->c_outline_data.nobjects == m->outline_hints.nobjects) {
        if (m->c_outline_data.nobjects == 0) {
            return;
        }

        if (m->c_outline_data.first_object == m->outline_hints.first_object) {
            // Check length and offset.  Acrobat gets these wrong.
            QPDFObjectHandle outlines = getRoot().getKey("/Outlines");
            if (!outlines.isIndirect()) {
                // This case is not exercised in test suite since not permitted by the spec, but if
                // this does occur, the code below would fail.
                linearizationWarning("/Outlines key of root dictionary is not indirect");
                return;
            }
            QPDFObjGen og(outlines.getObjGen());
            if (m->xref_table.count(og) == 0) {
                stopOnError("unknown object in outlines hint table");
            }
            qpdf_offset_t offset = getLinearizationOffset(og);
            ObjUser ou(ObjUser::ou_root_key, "/Outlines");
            int length = toI(maxEnd(ou) - offset);
            qpdf_offset_t table_offset = adjusted_offset(m->outline_hints.first_object_offset);
            if (offset != table_offset) {
                linearizationWarning(
                    "incorrect offset in outlines table: hint table = " +
                    std::to_string(table_offset) + "; computed = " + std::to_string(offset));
            }
            int table_length = m->outline_hints.group_length;
            if (length != table_length) {
                linearizationWarning(
                    "incorrect length in outlines table: hint table = " +
                    std::to_string(table_length) + "; computed = " + std::to_string(length));
            }
        } else {
            linearizationWarning("incorrect first object number in outline hints table.");
        }
    } else {
        linearizationWarning("incorrect object count in outline hint table");
    }
}